

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::(anonymous_namespace)::BasicAllFormatsLoadStoreComputeStage::
Read<tcu::Vector<unsigned_int,4>>
          (BasicAllFormatsLoadStoreComputeStage *this,GLenum internalformat,
          Vector<unsigned_int,_4> *value,Vector<unsigned_int,_4> *expected_value)

{
  bool bVar1;
  _Alloc_hider _Var2;
  _func_int **pp_Var3;
  GLuint shader;
  GLuint program;
  GLint GVar4;
  ostream *poVar5;
  GLenum e;
  GLenum e_00;
  GLenum e_01;
  Vector<unsigned_int,_4> *v;
  Vector<unsigned_int,_4> *v_00;
  CallLogWrapper *this_00;
  GLuint *pGVar6;
  bool bVar7;
  GLuint texture [2];
  vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_> data;
  string local_268;
  string local_248;
  char *src;
  undefined8 local_220;
  undefined2 local_218;
  undefined6 uStack_216;
  vec4 zero;
  undefined2 local_1f8;
  undefined6 uStack_1f6;
  string source;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  ostringstream os;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&os,
             "#version 420 core\n#extension GL_ARB_compute_shader : require\nlayout(local_size_x = 1) in;\nlayout("
             ,0x61);
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_248,(void *)(ulong)internalformat,e);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (&os.super_basic_ostream<char,_std::char_traits<char>_>,
                      local_248._M_dataplus._M_p,local_248._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,") readonly uniform ",0x13);
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  local_268.field_2._M_allocated_capacity._0_2_ = 0x75;
  local_268._M_string_length = 1;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_268._M_dataplus._M_p,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"image2D g_image_read;\nlayout(",0x1d);
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            ((string *)&data,(void *)(ulong)internalformat,e_00);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(char *)data.
                                     super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                      (long)data.
                            super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,") writeonly uniform ",0x14);
  local_1f8 = 0x75;
  zero.m_data[2] = 1.4013e-45;
  zero.m_data[3] = 0.0;
  zero.m_data._0_8_ = &local_1f8;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_1f8,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,
             "image2D g_image_write;\nvoid main() {\n  ivec2 coord = ivec2(int(gl_GlobalInvocationID.x), 0);\n  "
             ,0x5f);
  local_218 = 0x75;
  local_220 = 1;
  src = (char *)&local_218;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_218,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,
             "vec4 v = imageLoad(g_image_read, coord);\n  imageStore(g_image_write, coord, v);\n}",
             0x51);
  if (src != (char *)&local_218) {
    operator_delete(src,CONCAT62(uStack_216,local_218) + 1);
  }
  if ((undefined2 *)zero.m_data._0_8_ != &local_1f8) {
    operator_delete((void *)zero.m_data._0_8_,CONCAT62(uStack_1f6,local_1f8) + 1);
  }
  if (data.
      super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)&data.
                super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(data.
                    super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)(data.
                                   super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->m_data + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,
                    CONCAT62(local_268.field_2._M_allocated_capacity._2_6_,
                             local_268.field_2._M_allocated_capacity._0_2_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  std::ios_base::~ios_base
            ((ios_base *)&os.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
  src = source._M_dataplus._M_p;
  this_00 = (CallLogWrapper *)(this + 8);
  shader = glu::CallLogWrapper::glCreateShader(this_00,0x91b9);
  glu::CallLogWrapper::glShaderSource(this_00,shader,1,&src,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(this_00,shader);
  program = glu::CallLogWrapper::glCreateProgram(this_00);
  glu::CallLogWrapper::glAttachShader(this_00,program,shader);
  glu::CallLogWrapper::glLinkProgram(this_00,program);
  glu::CallLogWrapper::glDeleteShader(this_00,shader);
  std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::vector
            (&data,1,value,(allocator_type *)&os);
  glu::CallLogWrapper::glGenTextures(this_00,2,texture);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,texture[0]);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage2D
            (this_00,0xde1,0,internalformat,1,1,0,0x8d99,0x1405,
             data.
             super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,texture[1]);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
  zero.m_data[0] = 0.0;
  zero.m_data[1] = 0.0;
  zero.m_data[2] = 0.0;
  zero.m_data[3] = 0.0;
  glu::CallLogWrapper::glTexImage2D(this_00,0xde1,0,internalformat,1,1,0,0x8d99,0x1405,&zero);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
  glu::CallLogWrapper::glUseProgram(this_00,program);
  GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"g_image_read");
  glu::CallLogWrapper::glUniform1i(this_00,GVar4,0);
  GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"g_image_write");
  glu::CallLogWrapper::glUniform1i(this_00,GVar4,1);
  glu::CallLogWrapper::glBindImageTexture(this_00,0,texture[0],0,'\x01',0,35000,internalformat);
  glu::CallLogWrapper::glBindImageTexture(this_00,1,texture[1],0,'\x01',0,0x88b9,internalformat);
  glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
  pGVar6 = texture;
  bVar7 = true;
  while( true ) {
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,*pGVar6);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x100);
    glu::CallLogWrapper::glGetTexImage
              (this_00,0xde1,0,0x8d99,0x1405,
               data.
               super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    if (((((data.
            super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->m_data[0] != expected_value->m_data[0]) ||
         ((data.
           super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->m_data[1] != expected_value->m_data[1])) ||
        ((data.
          super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->m_data[2] != expected_value->m_data[2])) ||
       ((data.
         super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->m_data[3] != expected_value->m_data[3])) break;
    bVar1 = !bVar7;
    pGVar6 = texture + 1;
    bVar7 = false;
    if (bVar1) {
      glu::CallLogWrapper::glDeleteTextures(this_00,2,texture);
      glu::CallLogWrapper::glUseProgram(this_00,0);
      bVar7 = true;
      glu::CallLogWrapper::glDeleteProgram(this_00,program);
LAB_009a11af:
      if (data.
          super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(data.
                        super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)data.
                              super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)data.
                              super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)source._M_dataplus._M_p != &source.field_2) {
        operator_delete(source._M_dataplus._M_p,source.field_2._M_allocated_capacity + 1);
      }
      return bVar7;
    }
  }
  glu::CallLogWrapper::glDeleteTextures(this_00,4,texture);
  glu::CallLogWrapper::glUseProgram(this_00,0);
  glu::CallLogWrapper::glDeleteProgram(this_00,program);
  local_1b8 = *(undefined8 *)
               (data.
                super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->m_data;
  uStack_1b0 = *(undefined8 *)
                ((data.
                  super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->m_data + 2);
  ShaderImageLoadStoreBase::ToString<tcu::Vector<unsigned_int,4>>((string *)&os,&local_1b8,v);
  pp_Var3 = os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream;
  local_1c8 = *(undefined8 *)expected_value->m_data;
  uStack_1c0 = *(undefined8 *)(expected_value->m_data + 2);
  ShaderImageLoadStoreBase::ToString<tcu::Vector<unsigned_int,4>>(&local_248,&local_1c8,v_00);
  _Var2._M_p = local_248._M_dataplus._M_p;
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_268,(void *)(ulong)internalformat,e_01);
  gl4cts::anon_unknown_0::Output
            ("Value is: %s. Value should be: %s. Format is: %s.\n",pp_Var3,_Var2._M_p,
             local_268._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,
                    CONCAT62(local_268.field_2._M_allocated_capacity._2_6_,
                             local_268.field_2._M_allocated_capacity._0_2_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if (os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)&os.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                    os.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
  }
  bVar7 = false;
  goto LAB_009a11af;
}

Assistant:

bool Read(GLenum internalformat, const T& value, const T& expected_value)
	{
		GLuint			  program;
		std::string		  source = GenCS<T>(internalformat);
		const char* const src	= source.c_str();
		GLuint			  sh	 = glCreateShader(GL_COMPUTE_SHADER);
		glShaderSource(sh, 1, &src, NULL);
		glCompileShader(sh);
		program = glCreateProgram();
		glAttachShader(program, sh);
		glLinkProgram(program);
		glDeleteShader(sh);

		const int	  kSize = 1;
		std::vector<T> data(kSize * kSize, value);
		GLuint		   texture[2];
		glGenTextures(2, texture);

		glBindTexture(GL_TEXTURE_2D, texture[0]);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage2D(GL_TEXTURE_2D, 0, internalformat, kSize, kSize, 0, Format<T>(), Type<T>(), &data[0]);
		glBindTexture(GL_TEXTURE_2D, texture[1]);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		vec4 zero(0);
		glTexImage2D(GL_TEXTURE_2D, 0, internalformat, kSize, kSize, 0, Format<T>(), Type<T>(), &zero);

		glBindTexture(GL_TEXTURE_2D, 0);

		glUseProgram(program);
		glUniform1i(glGetUniformLocation(program, "g_image_read"), 0);
		glUniform1i(glGetUniformLocation(program, "g_image_write"), 1);

		glBindImageTexture(0, texture[0], 0, GL_TRUE, 0, GL_READ_ONLY, internalformat);
		glBindImageTexture(1, texture[1], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);

		glDispatchCompute(1, 1, 1);

		for (int i = 0; i < 2; ++i)
		{
			glBindTexture(GL_TEXTURE_2D, texture[i]);
			glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
			glGetTexImage(GL_TEXTURE_2D, 0, Format<T>(), Type<T>(), &data[0]);

			if (!Equal(data[0], expected_value, internalformat))
			{
				glDeleteTextures(4, texture);
				glUseProgram(0);
				glDeleteProgram(program);
				Output("Value is: %s. Value should be: %s. Format is: %s.\n", ToString(data[0]).c_str(),
					   ToString(expected_value).c_str(), FormatEnumToString(internalformat).c_str());
				return false;
			}
		}
		glDeleteTextures(2, texture);
		glUseProgram(0);
		glDeleteProgram(program);
		return true;
	}